

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildRender1bppRectFromString
               (ImFontAtlas *atlas,int x,int y,int w,int h,char *in_str,char in_marker_char,
               uchar in_marker_pixel_value)

{
  undefined1 uVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  long in_R9;
  int off_x;
  int off_y;
  uchar *out_pixel;
  int local_30;
  int local_2c;
  long local_28;
  long local_20;
  
  if ((in_ESI < 0) || (*(int *)(in_RDI + 0x28) < in_ESI + in_ECX)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x952,"ImFontAtlasBuildRender1bppRectFromString","ImGui ASSERT FAILED: %s",
                "x >= 0 && x + w <= atlas->TexWidth");
  }
  if ((in_EDX < 0) || (*(int *)(in_RDI + 0x2c) < in_EDX + in_R8D)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x953,"ImFontAtlasBuildRender1bppRectFromString","ImGui ASSERT FAILED: %s",
                "y >= 0 && y + h <= atlas->TexHeight");
  }
  local_28 = *(long *)(in_RDI + 0x18) + (long)in_ESI + (long)(in_EDX * *(int *)(in_RDI + 0x28));
  local_20 = in_R9;
  for (local_2c = 0; local_2c < in_R8D; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < in_ECX; local_30 = local_30 + 1) {
      uVar1 = out_pixel._0_1_;
      if (*(char *)(local_20 + local_30) != (char)off_x) {
        uVar1 = 0;
      }
      *(undefined1 *)(local_28 + local_30) = uVar1;
    }
    local_28 = local_28 + *(int *)(in_RDI + 0x28);
    local_20 = local_20 + in_ECX;
  }
  return;
}

Assistant:

void ImFontAtlasBuildRender1bppRectFromString(ImFontAtlas* atlas, int x, int y, int w, int h, const char* in_str, char in_marker_char, unsigned char in_marker_pixel_value)
{
    IM_ASSERT(x >= 0 && x + w <= atlas->TexWidth);
    IM_ASSERT(y >= 0 && y + h <= atlas->TexHeight);
    unsigned char* out_pixel = atlas->TexPixelsAlpha8 + x + (y * atlas->TexWidth);
    for (int off_y = 0; off_y < h; off_y++, out_pixel += atlas->TexWidth, in_str += w)
        for (int off_x = 0; off_x < w; off_x++)
            out_pixel[off_x] = (in_str[off_x] == in_marker_char) ? in_marker_pixel_value : 0x00;
}